

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O3

void __thiscall
swrenderer::DrawTiltedSpanPalCommand::DrawTiltedSpanPalCommand
          (DrawTiltedSpanPalCommand *this,int y,int x1,int x2,FVector3 *plane_sz,FVector3 *plane_su,
          FVector3 *plane_sv,bool plane_shade,int planeshade,float planelightfloat,fixed_t pviewx,
          fixed_t pviewy)

{
  float fVar1;
  uint8_t *puVar2;
  
  puVar2 = drawerargs::dc_destorg;
  (this->super_DrawerCommand)._dest_y =
       (int)((drawerargs::dc_dest - (long)drawerargs::dc_destorg) / (long)drawerargs::dc_pitch);
  (this->super_DrawerCommand)._vptr_DrawerCommand = (_func_int **)&PTR__DrawerCommand_006eacc8;
  *(int *)&(this->super_DrawerCommand).field_0xc = y;
  this->x1 = x1;
  this->x2 = x2;
  fVar1 = plane_sz->Y;
  (this->plane_sz).X = plane_sz->X;
  (this->plane_sz).Y = fVar1;
  (this->plane_sz).Z = plane_sz->Z;
  fVar1 = plane_su->Y;
  (this->plane_su).X = plane_su->X;
  (this->plane_su).Y = fVar1;
  (this->plane_su).Z = plane_su->Z;
  fVar1 = plane_sv->Y;
  (this->plane_sv).X = plane_sv->X;
  (this->plane_sv).Y = fVar1;
  (this->plane_sv).Z = plane_sv->Z;
  this->plane_shade = plane_shade;
  this->planeshade = planeshade;
  this->planelightfloat = planelightfloat;
  this->pviewx = pviewx;
  this->pviewy = pviewy;
  this->_colormap = drawerargs::ds_colormap;
  this->_destorg = puVar2;
  this->_ybits = drawerargs::ds_ybits;
  this->_xbits = drawerargs::ds_xbits;
  this->_source = drawerargs::ds_source;
  this->basecolormapdata = (uint8_t *)*basecolormap;
  return;
}

Assistant:

DrawTiltedSpanPalCommand::DrawTiltedSpanPalCommand(int y, int x1, int x2, const FVector3 &plane_sz, const FVector3 &plane_su, const FVector3 &plane_sv, bool plane_shade, int planeshade, float planelightfloat, fixed_t pviewx, fixed_t pviewy)
		: y(y), x1(x1), x2(x2), plane_sz(plane_sz), plane_su(plane_su), plane_sv(plane_sv), plane_shade(plane_shade), planeshade(planeshade), planelightfloat(planelightfloat), pviewx(pviewx), pviewy(pviewy)
	{
		using namespace drawerargs;

		_colormap = ds_colormap;
		_destorg = dc_destorg;
		_ybits = ds_ybits;
		_xbits = ds_xbits;
		_source = ds_source;
		basecolormapdata = basecolormap->Maps;
	}